

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O0

MCodeChunk * jit_assemble(MCodeChunk *__return_storage_ptr__,Trace *trace)

{
  ulong local_18;
  size_t i;
  Trace *trace_local;
  
  asm_allocate_registers(trace);
  asm_new();
  for (local_18 = 1; local_18 < (ulong)(long)trace->ir_count; local_18 = local_18 + 1) {
    asm_ins(__return_storage_ptr__,trace,trace->ir[local_18]);
  }
  return __return_storage_ptr__;
}

Assistant:

MCodeChunk jit_assemble(Trace *trace) {
	// Perform register allocation first
	asm_allocate_registers(trace);

	// Create an empty machine code chunk
	MCodeChunk chunk = asm_new();

	// Assemble the IR instruction by instruction
	for (size_t i = 1; i < trace->ir_count; i++) {
		asm_ins(&chunk, trace, trace->ir[i]);
	}

	return chunk;
}